

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_ibs.c
# Opt level: O2

err_t bignIdVerify(bign_params *params,octet *oid_der,size_t oid_len,octet *id_hash,octet *hash,
                  octet *id_sig,octet *id_pubkey,octet *pubkey)

{
  word *pwVar1;
  word *c;
  ulong n;
  ulong count;
  bool_t bVar2;
  err_t eVar3;
  int iVar4;
  size_t sVar5;
  ec_o *ec;
  ulong count_00;
  u64 *dest;
  u64 *dest_00;
  word *state;
  word wVar6;
  ulong n_00;
  void *stack;
  word *a;
  u64 *dest_01;
  
  bVar2 = memIsValid(params,0x150);
  if (bVar2 == 0) {
    eVar3 = 0x6d;
  }
  else {
    bVar2 = bignIsOperable(params);
    if (bVar2 == 0) {
      eVar3 = 0x1f6;
    }
    else {
      eVar3 = 0x12d;
      if ((oid_len != 0xffffffffffffffff) &&
         (sVar5 = oidFromDER((char *)0x0,oid_der,oid_len), sVar5 != 0xffffffffffffffff)) {
        sVar5 = bignStart_keep(params->l,bignIdVerify_deep);
        ec = (ec_o *)blobCreate(sVar5);
        if (ec == (ec_o *)0x0) {
          eVar3 = 0x6e;
        }
        else {
          eVar3 = bignStart(ec,params);
          if (eVar3 == 0) {
            n = ec->f->n;
            count = ec->f->no;
            bVar2 = memIsValid(id_hash,count);
            eVar3 = 0x6d;
            if ((bVar2 != 0) && (bVar2 = memIsValid(hash,count), bVar2 != 0)) {
              count_00 = count >> 1;
              bVar2 = memIsValid(id_sig,count_00 + count);
              if (bVar2 != 0) {
                bVar2 = memIsValid(id_pubkey,count * 2);
                if ((bVar2 != 0) && (bVar2 = memIsValid(pubkey,count * 2), bVar2 != 0)) {
                  a = (word *)((long)&(ec->hdr).keep + (ec->hdr).keep);
                  pwVar1 = a + n * 2;
                  dest = pwVar1 + n * 2;
                  n_00 = n >> 1;
                  dest_00 = dest + n_00 + n + 1;
                  c = dest_00 + n_00;
                  sVar5 = beltHash_keep();
                  stack = (void *)((long)c + sVar5 + n * 8 + 8);
                  bVar2 = (*ec->f->from)(a,id_pubkey,ec->f,stack);
                  eVar3 = 0x1f9;
                  if (((bVar2 != 0) &&
                      (((bVar2 = (*ec->f->from)(a + n,id_pubkey + count,ec->f,stack), bVar2 != 0 &&
                        (bVar2 = ecpIsOnA(a,ec,stack), bVar2 != 0)) &&
                       (bVar2 = (*ec->f->from)(pwVar1,pubkey,ec->f,stack), bVar2 != 0)))) &&
                     (bVar2 = (*ec->f->from)(pwVar1 + n,pubkey + count,ec->f,stack), bVar2 != 0)) {
                    dest_01 = dest + n_00 + 1;
                    u64From(dest_01,id_sig + count_00,count);
                    iVar4 = wwCmp(dest_01,ec->order,n);
                    eVar3 = 0x1fe;
                    if (iVar4 < 0) {
                      state = c + n + 1;
                      u64From(dest_00,hash,count);
                      iVar4 = wwCmp(dest_00,ec->order,n);
                      if (-1 < iVar4) {
                        zzSub2(dest_00,ec->order,n);
                      }
                      zzAddMod(dest_01,dest_01,dest_00,ec->order,n);
                      u64From(dest,id_sig,count_00);
                      dest[n_00] = 1;
                      beltHashStart(state);
                      beltHashStepH(oid_der,oid_len,state);
                      sVar5 = beltHash_keep();
                      memCopy(stack,state,sVar5);
                      beltHashStepH(id_pubkey,count,stack);
                      beltHashStepH(id_hash,count,stack);
                      beltHashStepG2((octet *)dest_00,count_00,stack);
                      u64From(dest_00,dest_00,count_00);
                      zzMul(c,dest_00,n_00,dest,n_00,stack);
                      wVar6 = zzAdd2(c + n_00,dest_00,n_00);
                      c[n] = wVar6;
                      wVar6 = zzAdd2(c + n_00,dest,n_00);
                      c[n] = wVar6 + c[n] + 1;
                      zzMod(c,c,n + 1,ec->order,n,stack);
                      zzNegMod(c,c,ec->order,n);
                      bVar2 = ecAddMulA(a,ec,stack,3,ec->base,dest_01,n,a,dest,n_00 + 1,pwVar1,c,n);
                      eVar3 = 0x1fe;
                      if (bVar2 != 0) {
                        (*ec->f->to)((octet *)a,a,ec->f,stack);
                        beltHashStepH(a,count,state);
                        beltHashStepH(id_hash,count,state);
                        beltHashStepH(hash,count,state);
                        bVar2 = beltHashStepV2(id_sig,count_00,state);
                        eVar3 = 0;
                        if (bVar2 == 0) {
                          eVar3 = 0x1fe;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          blobClose(ec);
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t bignIdVerify(const bign_params* params, const octet oid_der[], 
	size_t oid_len, const octet id_hash[], const octet hash[], 
	const octet id_sig[], const octet id_pubkey[], const octet pubkey[])
{
	err_t code;
	size_t no, n;
	// состояние (буферы R и V совпадают)
	void* state;
	ec_o* ec;			/* описание эллиптической кривой */	
	word* R;			/* [2n] открытый ключ R */
	word* Q;			/* [2n] открытый ключ Q */
	word* V;			/* [2n] точка V (V == R) */
	word* s0;			/* [n / 2 + 1] первая часть подписи */
	word* s1;			/* [n] вторая часть подписи */
	word* t;			/* [n / 2] переменная t */
	word* t1;			/* [n + 1] произведение (s0 + 2^l)(t + 2^l) */
	octet* hash_state;	/* [beltHash_keep] состояние хэширования */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len)  == SIZE_MAX)
		return ERR_BAD_OID;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignIdVerify_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	ASSERT(n % 2 == 0);
	// проверить входные указатели
	if (!memIsValid(id_hash, no) ||
		!memIsValid(hash, no) ||
		!memIsValid(id_sig, no + no / 2) ||
		!memIsValid(id_pubkey, 2 * no) ||
		!memIsValid(pubkey, 2 * no))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	R = V = objEnd(ec, word);
	Q = R + 2 * n;
	s0 = Q + 2 * n;
	s1 = s0 + n / 2 + 1;
	t = s1 + n;
	t1 = t + n / 2;
	hash_state = (octet*)(t1 + n + 1);
	stack = hash_state + beltHash_keep();
	// загрузить R
	if (!qrFrom(ecX(R), id_pubkey, ec->f, stack) ||
		!qrFrom(ecY(R, n), id_pubkey + no, ec->f, stack) ||
		!ecpIsOnA(R, ec, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// загрузить Q
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, n), pubkey + no, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// загрузить и проверить s1
	wwFrom(s1, id_sig + no / 2, no);
	if (wwCmp(s1, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_SIG;
	}
	// s1 <- (s1 + H) mod q
	wwFrom(t, hash, no);
	if (wwCmp(t, ec->order, n) >= 0)
	{
		zzSub2(t, ec->order, n);
		// 2^{l - 1} < q < 2^l, H < 2^l => H - q < q
		ASSERT(wwCmp(t, ec->order, n) < 0);
	}
	zzAddMod(s1, s1, t, ec->order, n);
	// загрузить s0
	wwFrom(s0, id_sig, no / 2);
	s0[n / 2] = 1;
	// belt-hash(oid...)
	beltHashStart(hash_state);
	beltHashStepH(oid_der, oid_len, hash_state);
	// t <- belt-hash(oid || R || H0) mod 2^l
	memCopy(stack, hash_state, beltHash_keep());
	beltHashStepH(id_pubkey, no, stack);
	beltHashStepH(id_hash, no, stack);
	beltHashStepG2((octet*)t, no / 2, stack);
	wwFrom(t, t, no / 2);
	// t1 <- -(t + 2^l)(s0 + 2^l) mod q
	zzMul(t1, t, n / 2, s0, n / 2, stack);
	t1[n] = zzAdd2(t1 + n / 2, t, n / 2);
	t1[n] += zzAdd2(t1 + n / 2, s0, n / 2);
	++t1[n];
	zzMod(t1, t1, n + 1, ec->order, n, stack);
	zzNegMod(t1, t1, ec->order, n);
	// V <- s1 G + (s0 + 2^l) R + t Q
	if (!ecAddMulA(V, ec, stack,
		3, ec->base, s1, n, R, s0, n / 2 + 1, Q, t1, n))
	{
		blobClose(state);
		return ERR_BAD_SIG;
	}
	qrTo((octet*)V, ecX(V), ec->f, stack);
	// s0 == belt-hash(oid || V || H0 || H) mod 2^l?
	beltHashStepH(V, no, hash_state);
	beltHashStepH(id_hash, no, hash_state);
	beltHashStepH(hash, no, hash_state);
	code = beltHashStepV2(id_sig, no / 2, hash_state) ? ERR_OK : ERR_BAD_SIG;
	// завершение
	blobClose(state);
	return code;
}